

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_pre.h
# Opt level: O2

void __thiscall Logger::~Logger(Logger *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  depth_ = depth_ + -1;
  Indent(this);
  iVar1 = std::uncaught_exceptions();
  pcVar3 = "SUCCESS: ";
  if (0 < iVar1) {
    pcVar3 = "FAIL: ";
  }
  std::operator<<((ostream *)&std::cerr,pcVar3);
  poVar2 = std::operator<<((ostream *)&std::cerr,this->name_);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

~Logger() {
        --depth_;
        Indent();
        if (std::uncaught_exceptions() > 0) {
            std::cerr << "FAIL: ";
        } else {
            std::cerr << "SUCCESS: ";
        }
        std::cerr << name_ << std::endl;
    }